

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O0

string * fs_absolute_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,string_view base,
                   bool expand_tilde)

{
  string_view path_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_b0 [8];
  string b;
  allocator<char> local_69;
  char *local_68;
  char *local_60;
  undefined1 local_58 [8];
  string ex;
  bool expand_tilde_local;
  string_view base_local;
  string_view path_local;
  
  base_local._M_len = (size_t)base._M_str;
  base_local._M_str = (char *)path._M_len;
  ex.field_2._M_local_buf[0xf] = expand_tilde;
  if (expand_tilde) {
    local_68 = base_local._M_str;
    local_60 = path._M_str;
    fs_expanduser_abi_cxx11_((string *)local_58,path);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_58,
               (basic_string_view<char,_std::char_traits<char>_> *)&base_local._M_str,&local_69);
    std::allocator<char>::~allocator(&local_69);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((!bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&base_local._M_str),
     bVar1)) {
    join_0x00000010_0x00000000_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    bVar1 = fs_is_absolute(join_0x00000010_0x00000000_);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
    }
    else {
      path_00._M_str = (char *)base_local._M_len;
      path_00._M_len = base._M_len;
      fs_absolute_abi_cxx11_((string *)local_b0,path_00,(bool)(ex.field_2._M_local_buf[0xf] & 1));
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
        ;
        if (!bVar1) {
          pcVar2 = (char *)std::__cxx11::string::back();
          if (*pcVar2 != '/') {
            std::__cxx11::string::push_back((char)local_b0);
          }
          std::__cxx11::string::append((string *)local_b0);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_b0);
      }
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, std::string_view base, const bool expand_tilde)
{
  // rebase path on base.

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty() && !path.empty()) FFS_UNLIKELY
    return {};

  if(fs_is_absolute(ex))
    return ex;

  std::string b = fs_absolute(base, expand_tilde);
  if(b.empty())  FFS_UNLIKELY
    return {};

  if(!ex.empty()){
    if(b.back() != '/')
      b.push_back('/');

    // don't need join(). Keeps it like Python pathlib.Path.absolute()
    b.append(ex);
  }

  return b;
}